

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O0

JL_STATUS JlFreeObjectTree(JlDataObject **pRootObject)

{
  JlDataObject *Object;
  JL_DATA_TYPE JVar1;
  JlListItem *local_40;
  JlListItem *listItem;
  JlListItem *prevListItem;
  JlDictionaryItem *dictionaryItem;
  JlDictionaryItem *prevDictionaryItem;
  JlDataObject *object;
  JL_DATA_TYPE objectType;
  JL_STATUS jlStatus;
  JlDataObject **pRootObject_local;
  
  if ((pRootObject == (JlDataObject **)0x0) || (*pRootObject == (JlDataObject *)0x0)) {
    object._4_4_ = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    Object = *pRootObject;
    JVar1 = JlGetObjectType(Object);
    switch(JVar1) {
    case JL_DATA_TYPE_STRING:
      if ((Object->field_2).String != (char *)0x0) {
        WjTestLib_Free((Object->field_2).String);
        (Object->field_2).String = (char *)0x0;
      }
      object._4_4_ = JL_STATUS_SUCCESS;
      break;
    case JL_DATA_TYPE_NUMBER:
    case JL_DATA_TYPE_BOOL:
      object._4_4_ = JL_STATUS_SUCCESS;
      break;
    case JL_DATA_TYPE_LIST:
      listItem = (JlListItem *)0x0;
      object._4_4_ = JL_STATUS_SUCCESS;
      for (local_40 = (Object->field_2).List.ListHead; local_40 != (JlListItem *)0x0;
          local_40 = local_40->Next) {
        if (listItem != (JlListItem *)0x0) {
          WjTestLib_Free(listItem);
        }
        object._4_4_ = JlFreeObjectTree(&local_40->Object);
        local_40->Object = (JlDataObject *)0x0;
        listItem = local_40;
        if (object._4_4_ != JL_STATUS_SUCCESS) break;
      }
      if (listItem != (JlListItem *)0x0) {
        WjTestLib_Free(listItem);
      }
      break;
    case JL_DATA_TYPE_DICTIONARY:
      dictionaryItem = (JlDictionaryItem *)0x0;
      object._4_4_ = JL_STATUS_SUCCESS;
      for (prevListItem = (JlListItem *)(Object->field_2).Dictionary.DictionaryHead;
          prevListItem != (JlListItem *)0x0; prevListItem = prevListItem->Next) {
        if (dictionaryItem != (JlDictionaryItem *)0x0) {
          WjTestLib_Free(dictionaryItem);
        }
        WjTestLib_Free(prevListItem->Object);
        prevListItem->Object = (JlDataObject *)0x0;
        object._4_4_ = JlFreeObjectTree((JlDataObject **)(prevListItem + 1));
        dictionaryItem = (JlDictionaryItem *)prevListItem;
        if (object._4_4_ != JL_STATUS_SUCCESS) break;
      }
      if (dictionaryItem != (JlDictionaryItem *)0x0) {
        WjTestLib_Free(dictionaryItem);
      }
      break;
    default:
      object._4_4_ = JL_STATUS_CORRUPT_MEMORY;
    }
    WjTestLib_Free(Object);
    *pRootObject = (JlDataObject *)0x0;
  }
  return object._4_4_;
}

Assistant:

JL_STATUS
    JlFreeObjectTree
    (
        JlDataObject**              pRootObject
    )
{
    JL_STATUS jlStatus;
    JL_DATA_TYPE objectType = JL_DATA_TYPE_NONE;

    if(     NULL != pRootObject
        &&  NULL != *pRootObject )
    {
        JlDataObject* object = *pRootObject;

        objectType = JlGetObjectType( object );
        switch( objectType )
        {
        case JL_DATA_TYPE_STRING:
            if( NULL != object->String )
            {
                JlFree( object->String );
                object->String = NULL;
            }
            jlStatus = JL_STATUS_SUCCESS;
            break;
        case JL_DATA_TYPE_NUMBER:
        case JL_DATA_TYPE_BOOL:
            jlStatus = JL_STATUS_SUCCESS;
            break;
        case JL_DATA_TYPE_DICTIONARY:
        {
            JlDictionaryItem* prevDictionaryItem = NULL;
            jlStatus = JL_STATUS_SUCCESS;
            for( JlDictionaryItem* dictionaryItem=object->Dictionary.DictionaryHead; dictionaryItem!=NULL; dictionaryItem=dictionaryItem->Next )
            {
                if( NULL != prevDictionaryItem )
                {
                    JlFree( prevDictionaryItem );
                    prevDictionaryItem = NULL;
                }
                JlFree( dictionaryItem->KeyName );
                dictionaryItem->KeyName = NULL;
                jlStatus = JlFreeObjectTree( &dictionaryItem->Object );
                prevDictionaryItem = dictionaryItem;
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    break;
                }
            }
            if( NULL != prevDictionaryItem )
            {
                JlFree( prevDictionaryItem );
                prevDictionaryItem = NULL;
            }
            break;
        }
        case JL_DATA_TYPE_LIST:
        {
            JlListItem* prevListItem = NULL;
            jlStatus = JL_STATUS_SUCCESS;
            for( JlListItem* listItem=object->List.ListHead; listItem!=NULL; listItem=listItem->Next )
            {
                if( NULL != prevListItem )
                {
                    JlFree( prevListItem );
                    prevListItem = NULL;
                }
                jlStatus = JlFreeObjectTree( &listItem->Object );
                listItem->Object = NULL;
                prevListItem = listItem;
                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    break;
                }
            }
            if( NULL != prevListItem )
            {
                JlFree( prevListItem );
                prevListItem = NULL;
            }
            break;
        }
        default:
            jlStatus = JL_STATUS_CORRUPT_MEMORY;
            break;
        }

        // Now free the object container
        JlFree( object );
        object = NULL;
        *pRootObject = NULL;
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}